

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

bool __thiscall
btSoftBody::checkContact
          (btSoftBody *this,btCollisionObjectWrapper *colObjWrap,btVector3 *x,btScalar margin,
          sCti *cti)

{
  btCollisionShape *shape;
  btTransform *this_00;
  btSoftBodyWorldInfo *pbVar1;
  btScalar bVar2;
  btVector3 bVar3;
  btScalar dst;
  btVector3 nrm;
  btScalar local_54;
  btVector3 local_50;
  btVector3 local_40;
  
  shape = colObjWrap->m_shape;
  this_00 = colObjWrap->m_worldTransform;
  pbVar1 = this->m_worldInfo;
  local_50 = btTransform::invXform(this_00,x);
  bVar2 = btSparseSdf<3>::Evaluate(&pbVar1->m_sparsesdf,&local_50,shape,&local_40,margin);
  if (bVar2 < 0.0) {
    cti->m_colObj = colObjWrap->m_collisionObject;
    local_54 = bVar2;
    bVar3 = operator*(&this_00->m_basis,&local_40);
    *&(cti->m_normal).m_floats = bVar3.m_floats;
    local_50 = operator*(&cti->m_normal,&local_54);
    bVar3 = operator-(x,&local_50);
    cti->m_offset =
         -(bVar3.m_floats[2] * (cti->m_normal).m_floats[2] +
          (cti->m_normal).m_floats[0] * bVar3.m_floats[0] +
          bVar3.m_floats[1] * (cti->m_normal).m_floats[1]);
  }
  return bVar2 < 0.0;
}

Assistant:

bool				btSoftBody::checkContact(	const btCollisionObjectWrapper* colObjWrap,
											 const btVector3& x,
											 btScalar margin,
											 btSoftBody::sCti& cti) const
{
	btVector3 nrm;
	const btCollisionShape *shp = colObjWrap->getCollisionShape();
//	const btRigidBody *tmpRigid = btRigidBody::upcast(colObjWrap->getCollisionObject());
	//const btTransform &wtr = tmpRigid ? tmpRigid->getWorldTransform() : colObjWrap->getWorldTransform();
	const btTransform &wtr = colObjWrap->getWorldTransform();
	//todo: check which transform is needed here

	btScalar dst = 
		m_worldInfo->m_sparsesdf.Evaluate(	
			wtr.invXform(x),
			shp,
			nrm,
			margin);
	if(dst<0)
	{
		cti.m_colObj = colObjWrap->getCollisionObject();
		cti.m_normal = wtr.getBasis()*nrm;
		cti.m_offset = -btDot( cti.m_normal, x - cti.m_normal * dst );
		return(true);
	}
	return(false);
}